

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O0

bool __thiscall hwtest::pgraph::MthdCelsiusLightEnable::is_valid_val(MthdCelsiusLightEnable *this)

{
  bool bVar1;
  uint uVar2;
  int local_20;
  int mode;
  int i;
  bool off;
  MthdCelsiusLightEnable *this_local;
  
  if (((this->super_SingleMthdTest).super_MthdTest.val & 0xffff0000) == 0) {
    bVar1 = false;
    for (local_20 = 0; local_20 < 8; local_20 = local_20 + 1) {
      uVar2 = (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val <<
                     ((char)local_20 * -2 + 0x3eU & 0x3f)) >> 0x3e);
      if ((bVar1) && (uVar2 != 0)) {
        return false;
      }
      if (uVar2 == 0) {
        bVar1 = true;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool is_valid_val() override {
		if (val & ~0xffff)
			return false;
		bool off = false;
		for (int i = 0; i < 8; i++) {
			int mode = extr(val, i * 2, 2);
			if (off && mode != 0)
				return false;
			if (mode == 0)
				off = true;
		}
		return true;
	}